

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_bufput_kfold_rep(jit_State *J)

{
  uint64_t uVar1;
  TRef TVar2;
  IRIns *pIVar3;
  SBuf *sb_00;
  GCobj *o;
  SBuf *sb;
  IRIns *irc;
  jit_State *J_local;
  SBuf *sb_1;
  
  if (((J->fold).left[0].field_0.op2 < 0x8000) &&
     (pIVar3 = (J->cur).ir + (J->fold).left[0].field_0.op1, (pIVar3->field_0).op2 < 0x8000)) {
    uVar1 = (J->L->glref).ptr64;
    *(lua_State **)(uVar1 + 0xe0) = J->L;
    ((SBuf *)(uVar1 + 200))->w = *(char **)(uVar1 + 0xd8);
    sb_00 = lj_buf_putstr_rep((SBuf *)(uVar1 + 200),
                              (GCstr *)(J->cur).ir[(ulong)(pIVar3->field_0).op2 + 1],
                              (J->cur).ir[(J->fold).left[0].field_0.op2].i);
    (J->fold).ins.field_1.o = 'V';
    (J->fold).ins.field_0.op1 = (pIVar3->field_0).op1;
    o = (GCobj *)lj_buf_tostr(sb_00);
    TVar2 = lj_ir_kgc(J,o,IRT_STR);
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    J_local._4_4_ = 1;
  }
  else {
    J_local._4_4_ = lj_ir_emit(J);
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(CALLL CARG IRCALL_lj_buf_putstr_rep)
LJFOLDF(bufput_kfold_rep)
{
  if (irref_isk(fleft->op2)) {
    IRIns *irc = IR(fleft->op1);
    if (irref_isk(irc->op2)) {
      SBuf *sb = lj_buf_tmp_(J->L);
      sb = lj_buf_putstr_rep(sb, ir_kstr(IR(irc->op2)), IR(fleft->op2)->i);
      fins->o = IR_BUFPUT;
      fins->op1 = irc->op1;
      fins->op2 = lj_ir_kstr(J, lj_buf_tostr(sb));
      return RETRYFOLD;
    }
  }
  return EMITFOLD;  /* Always emit, CSE later. */
}